

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcTransportElement::~IfcTransportElement(IfcTransportElement *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  this_00 = &this[-1].super_IfcElement.super_IfcProduct.super_IfcObject.field_0x70;
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.super_IfcObject.field_0x70 = 0x8c1318;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x58 = 0x8c1408;
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.Representation.have = 0x8c1340;
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.field_0x108 = 0x8c1368;
  *(undefined8 *)&this[-1].super_IfcElement.field_0x140 = 0x8c1390;
  this[-1].CapacityByWeight.ptr = 4.53556610659948e-317;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0x8c13e0;
  puVar1 = *(undefined1 **)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x10;
  puVar2 = &(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x20;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this_00,&PTR_construction_vtable_24__008c1420);
  operator_delete(this_00,0x1a8);
  return;
}

Assistant:

IfcTransportElement() : Object("IfcTransportElement") {}